

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O2

void __thiscall
chrono::curiosity::CuriosityDCMotorControl::Update(CuriosityDCMotorControl *this,double time)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined8 uVar4;
  Curiosity *pCVar5;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  pCVar5 = (this->super_CuriosityDriver).curiosity;
  lVar7 = 0;
  while (lVar7 != 0x30) {
    lVar6 = *(long *)((long)&(pCVar5->m_drive_shafts)._M_elems[0].
                             super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     + lVar7 * 2);
    dVar1 = *(double *)((long)(this->m_no_load_speed)._M_elems + lVar7);
    auVar8 = SUB6416(ZEXT864(0),0) << 0x40;
    dVar2 = *(double *)(lVar6 + 0x90);
    if (-dVar2 <= dVar1) {
      dVar3 = *(double *)((long)(this->m_stall_torque)._M_elems + lVar7);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = dVar3;
      if (dVar2 <= 0.0) {
        auVar8._8_8_ = 0;
        auVar8._0_8_ = ((dVar2 + dVar1) / dVar1) * dVar3;
      }
    }
    auVar9._0_8_ = auVar8._0_8_ ^ 0x8000000000000000;
    auVar9._8_8_ = auVar8._8_8_ ^ 0x8000000000000000;
    lVar7 = lVar7 + 8;
    uVar4 = vmovlpd_avx(auVar9);
    *(undefined8 *)(lVar6 + 0x80) = uVar4;
  }
  return;
}

Assistant:

void CuriosityDCMotorControl::Update(double time) {
    double speed_reading;
    double target_torque;
    for (int i = 0; i < 6; i++) {
        speed_reading = -curiosity->m_drive_shafts[i]->GetPos_dt();

        if (speed_reading > m_no_load_speed[i]) {
            target_torque = 0;
        } else if (speed_reading < 0) {
            target_torque = m_stall_torque[i];
        } else {
            target_torque = m_stall_torque[i] * ((m_no_load_speed[i] - speed_reading) / m_no_load_speed[i]);
        }
        curiosity->m_drive_shafts[i]->SetAppliedTorque(-target_torque);
    }
}